

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

Result __thiscall
presolve::HPresolve::removeSlacks(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  int row;
  int node;
  pointer pdVar6;
  pointer pdVar7;
  double *pdVar8;
  HighsLp *pHVar9;
  uint uVar10;
  ulong uVar11;
  double rhs;
  double dVar12;
  iterator __begin3;
  iterator local_78;
  double local_38;
  
  pHVar9 = this->model;
  uVar10 = pHVar9->num_col_;
  if (uVar10 != 0) {
    uVar11 = 0;
    do {
      if ((((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar11] == '\0') &&
          ((this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11] == 1)) &&
         ((pHVar9->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar11] != kInteger)) {
        uVar5 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11];
        row = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar5];
        pdVar6 = (pHVar9->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (pHVar9->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        rhs = pdVar6[row];
        pdVar8 = pdVar7 + row;
        if ((rhs == *pdVar8) && (!NAN(rhs) && !NAN(*pdVar8))) {
          dVar1 = (pHVar9->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11];
          dVar2 = (pHVar9->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11];
          pdVar8 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar3 = pdVar8[(int)uVar5];
          dVar12 = dVar1;
          if (dVar3 <= 0.0) {
            dVar12 = dVar2;
          }
          dVar4 = (pHVar9->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11];
          pdVar6[row] = rhs - (double)(~-(ulong)(0.0 < dVar3) & (ulong)dVar1 |
                                      (ulong)dVar2 & -(ulong)(0.0 < dVar3)) * dVar3;
          pdVar7[row] = rhs - dVar12 * dVar3;
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            node = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[row];
            local_38 = rhs;
            if (node == -1) {
              local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_78.nodeLeft = (pointer)0x0;
              local_78.nodeRight = (pointer)0x0;
              local_78.pos_.index_ = (int *)0x0;
              local_78.pos_.value_ = (double *)0x0;
              local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_78.currentNode = -1;
            }
            else {
              HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::iterator
                        (&local_78,
                         (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,pdVar8,
                         (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,node);
            }
            while (local_78.currentNode != -1) {
              pdVar6 = (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pdVar6[*local_78.pos_.index_] =
                   *local_78.pos_.value_ * -(dVar4 / dVar3) + pdVar6[*local_78.pos_.index_];
              HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(&local_78);
            }
            if (local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            this->model->offset_ = (dVar4 / dVar3) * local_38 + this->model->offset_;
            rhs = local_38;
          }
          local_78.pos_.value_ =
               (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78.pos_.index_ =
               (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78.nodeLeft =
               (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78.nodeRight =
               (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.stack.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (this->rowroot).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[row]);
          HighsPostsolveStack::slackColSubstitution<HighsTripletTreeSlicePreOrder>
                    (postsolve_stack,row,(HighsInt)uVar11,rhs,
                     (HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *)&local_78);
          (this->changedColFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar11] = '\x01';
          (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar11] = '\x01';
          this->numDeletedCols = this->numDeletedCols + 1;
          unlink(this,(char *)(ulong)uVar5);
          pHVar9 = this->model;
          uVar10 = pHVar9->num_col_;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar10);
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::removeSlacks(
    HighsPostsolveStack& postsolve_stack) {
  // SingletonColumns data structure appears not to be retained
  // throughout presolve
  for (HighsInt iCol = 0; iCol != model->num_col_; ++iCol) {
    if (colDeleted[iCol]) continue;
    if (colsize[iCol] != 1) continue;
    if (model->integrality_[iCol] == HighsVarType::kInteger) continue;
    HighsInt coliter = colhead[iCol];
    HighsInt iRow = Arow[coliter];
    assert(Acol[coliter] == iCol);
    assert(!rowDeleted[iRow]);
    if (model->row_lower_[iRow] != model->row_upper_[iRow]) continue;
    double lower = model->col_lower_[iCol];
    double upper = model->col_upper_[iCol];
    double cost = model->col_cost_[iCol];
    double rhs = model->row_lower_[iRow];
    double coeff = Avalue[coliter];
    assert(coeff);
    // Slack is s = (rhs - a^Tx)/coeff
    //
    // Constraint bounds become:
    //
    // For coeff > 0 [rhs - coeff * upper, rhs - coeff * lower]
    //
    // For coeff < 0 [rhs - coeff * lower, rhs - coeff * upper]
    model->row_lower_[iRow] =
        coeff > 0 ? rhs - coeff * upper : rhs - coeff * lower;
    model->row_upper_[iRow] =
        coeff > 0 ? rhs - coeff * lower : rhs - coeff * upper;
    if (cost) {
      // Cost is (cost * rhs / coeff) + (col_cost - (cost/coeff) row_values)^Tx
      double multiplier = cost / coeff;
      for (const HighsSliceNonzero& nonzero : getRowVector(iRow)) {
        HighsInt local_iCol = nonzero.index();
        double local_value = nonzero.value();
        model->col_cost_[local_iCol] -= multiplier * local_value;
      }
      model->offset_ += multiplier * rhs;
    }
    //
    postsolve_stack.slackColSubstitution(iRow, iCol, rhs, getRowVector(iRow));

    markColDeleted(iCol);

    unlink(coliter);
  }
  return Result::kOk;
}